

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDOperand *md)

{
  FILE *__stream;
  MetadataKind MVar1;
  NamedMDNode *md_00;
  MDNode *md_01;
  ConstantAsMetadata *this_00;
  Constant *value;
  MDString *this_01;
  String *ts;
  LoggingCallback p_Var2;
  void *pvVar3;
  char local_1028 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  MDOperand *md_local;
  StreamState *this_local;
  
  if (md == (MDOperand *)0x0) {
    append(this,"null");
  }
  else {
    MVar1 = MDOperand::get_metadata_kind(md);
    switch(MVar1) {
    case NamedNode:
      md_00 = cast<LLVMBC::NamedMDNode>(md);
      append(this,md_00);
      break;
    case Node:
      md_01 = cast<LLVMBC::MDNode>(md);
      append(this,md_01,false);
      break;
    case Constant:
      this_00 = cast<LLVMBC::ConstantAsMetadata>(md);
      value = ConstantAsMetadata::getValue(this_00);
      append(this,value,false);
      break;
    case String:
      this_01 = cast<LLVMBC::MDString>(md);
      ts = MDString::getString_abi_cxx11_(this_01);
      append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
                (this,(char (*) [2])0x2a2d60,ts,(char (*) [2])0x2a2d60);
      break;
    case None:
      append(this,"null");
      break;
    default:
      p_Var2 = dxil_spv::get_thread_log_callback();
      __stream = _stderr;
      if (p_Var2 == (LoggingCallback)0x0) {
        MVar1 = MDOperand::get_metadata_kind(md);
        fprintf(__stream,"[ERROR]: Unknown MetadataKind %u.\n",(ulong)MVar1);
        fflush(_stderr);
      }
      else {
        MVar1 = MDOperand::get_metadata_kind(md);
        snprintf(local_1028,0x1000,"Unknown MetadataKind %u.\n",(ulong)MVar1);
        pvVar3 = dxil_spv::get_thread_log_callback_userdata();
        (*p_Var2)(pvVar3,Error,local_1028);
      }
    }
  }
  return;
}

Assistant:

void StreamState::append(MDOperand *md)
{
	if (md)
	{
		switch (md->get_metadata_kind())
		{
		case MetadataKind::NamedNode:
			return append(cast<NamedMDNode>(md));
		case MetadataKind::Node:
			return append(cast<MDNode>(md), false);
		case MetadataKind::Constant:
			return append(cast<ConstantAsMetadata>(md)->getValue());
		case MetadataKind::String:
			return append("\"", cast<MDString>(md)->getString(), "\"");
		case MetadataKind::None:
			return append("null");
		default:
			LOGE("Unknown MetadataKind %u.\n", unsigned(md->get_metadata_kind()));
			break;
		}
	}
	else
		append("null");
}